

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

size_t mdns_string_find(char *str,size_t length,char c,size_t offset)

{
  void *pvVar1;
  void *found;
  size_t offset_local;
  char c_local;
  size_t length_local;
  char *str_local;
  
  if (offset < length) {
    pvVar1 = memchr(str + offset,(int)c,length - offset);
    if (pvVar1 == (void *)0x0) {
      str_local = (char *)0xffffffffffffffff;
    }
    else {
      str_local = (char *)((long)pvVar1 - (long)str);
    }
  }
  else {
    str_local = (char *)0xffffffffffffffff;
  }
  return (size_t)str_local;
}

Assistant:

size_t
mdns_string_find(const char* str, size_t length, char c, size_t offset) {
	const void* found;
	if (offset >= length)
		return MDNS_INVALID_POS;
	found = memchr(str + offset, c, length - offset);
	if (found)
		return (size_t)((const char*)found - str);
	return MDNS_INVALID_POS;
}